

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_17(QPDF *pdf,char *arg2)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  allocator local_219;
  string local_218 [8];
  string contents;
  string local_1f0 [32];
  QPDFObjectHandle local_1d0;
  QPDFObjectHandle local_1c0;
  undefined1 local_1b0 [8];
  shared_ptr<Buffer> b;
  allocator<char> local_189;
  string local_188 [32];
  QPDFObjectHandle local_168;
  QPDFObjectHandle local_158;
  QPDFObjGen local_144;
  allocator<char> local_139;
  string local_138 [32];
  QPDFObjectHandle local_118;
  QPDFObjectHandle local_108;
  QPDFObjGen local_f8;
  QPDFObjGen local_f0;
  QPDFObjGen local_e8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_e0;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pages;
  QPDFObjGen local_c8;
  QPDFObjectHandle local_c0;
  QPDFObjGen local_ac;
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [32];
  QPDFObjectHandle local_48;
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle page_kids;
  char *arg2_local;
  QPDF *pdf_local;
  
  page_kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"/Pages",&local_69);
  QPDFObjectHandle::getKey((string *)&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"/Kids",&local_a1);
  QPDFObjectHandle::getKey((string *)local_28);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  QPDFObjectHandle::~QPDFObjectHandle(&local_48);
  QPDFObjectHandle::getArrayItem((int)&local_c0);
  local_ac = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  QPDFObjectHandle::getArrayItem((int)&pages);
  local_c8 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar1 = QPDFObjGen::operator==(&local_ac,&local_c8);
  if (!bVar1) {
    __assert_fail("page_kids.getArrayItem(0).getObjGen() == page_kids.getArrayItem(1).getObjGen()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x30a,"void test_17(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&pages);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c0);
  local_e0 = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  sVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_e0);
  if (sVar2 != 3) {
    __assert_fail("pages.size() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x30c,"void test_17(QPDF &, const char *)");
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_e0,0);
  local_e8 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_e0,1);
  local_f0 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar1 = QPDFObjGen::operator==(&local_e8,&local_f0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(pages.at(0).getObjGen() == pages.at(1).getObjGen())",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x30d,"void test_17(QPDF &, const char *)");
  }
  pvVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_e0,0);
  QPDFObjectHandle::QPDFObjectHandle(&local_118,pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"/Contents",&local_139);
  QPDFObjectHandle::getKey((string *)&local_108);
  local_f8 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  pvVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_e0,1);
  QPDFObjectHandle::QPDFObjectHandle(&local_168,pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"/Contents",&local_189);
  QPDFObjectHandle::getKey((string *)&local_158);
  local_144 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  bVar1 = QPDFObjGen::operator==(&local_f8,&local_144);
  if (!bVar1) {
    __assert_fail("QPDFObjectHandle(pages.at(0)).getKey(\"/Contents\").getObjGen() == QPDFObjectHandle(pages.at(1)).getKey(\"/Contents\").getObjGen()"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x310,"void test_17(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_158);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  QPDFObjectHandle::~QPDFObjectHandle(&local_168);
  QPDFObjectHandle::~QPDFObjectHandle(&local_108);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  QPDFObjectHandle::~QPDFObjectHandle(&local_118);
  pvVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_e0,0);
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pvVar3);
  QPDF::removePage((QPDFObjectHandle *)pdf);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &b.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size(local_e0);
  if (sVar2 != 2) {
    __assert_fail("pages.size() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x312,"void test_17(QPDF &, const char *)");
  }
  pvVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at(local_e0,0);
  QPDFObjectHandle::QPDFObjectHandle(&local_1d0,pvVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f0,"/Contents",(allocator<char> *)(contents.field_2._M_local_buf + 0xf));
  QPDFObjectHandle::getKey((string *)&local_1c0);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_1b0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1c0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)(contents.field_2._M_local_buf + 0xf));
  QPDFObjectHandle::~QPDFObjectHandle(&local_1d0);
  std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_1b0);
  pcVar4 = (char *)Buffer::getBuffer();
  std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_1b0);
  uVar5 = Buffer::getSize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,pcVar4,uVar5,&local_219);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  lVar6 = std::__cxx11::string::find((char *)local_218,0x171d46);
  if (lVar6 != -1) {
    std::__cxx11::string::~string(local_218);
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_1b0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
    return;
  }
  __assert_fail("contents.find(\"page 0\") != std::string::npos",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x315,"void test_17(QPDF &, const char *)");
}

Assistant:

static void
test_17(QPDF& pdf, char const* arg2)
{
    // The input file to this test case has a duplicated page.
    QPDFObjectHandle page_kids = pdf.getRoot().getKey("/Pages").getKey("/Kids");
    assert(page_kids.getArrayItem(0).getObjGen() == page_kids.getArrayItem(1).getObjGen());
    std::vector<QPDFObjectHandle> const& pages = pdf.getAllPages();
    assert(pages.size() == 3);
    assert(!(pages.at(0).getObjGen() == pages.at(1).getObjGen()));
    assert(
        QPDFObjectHandle(pages.at(0)).getKey("/Contents").getObjGen() ==
        QPDFObjectHandle(pages.at(1)).getKey("/Contents").getObjGen());
    pdf.removePage(pages.at(0));
    assert(pages.size() == 2);
    std::shared_ptr<Buffer> b = QPDFObjectHandle(pages.at(0)).getKey("/Contents").getStreamData();
    std::string contents = std::string(reinterpret_cast<char const*>(b->getBuffer()), b->getSize());
    assert(contents.find("page 0") != std::string::npos);
}